

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::MergeFrom
          (LayerNormalizationLayerParams *this,LayerNormalizationLayerParams *from)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  WeightParams *pWVar5;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x10f20);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar2 = (from->normalizedshape_).current_size_;
  if (iVar2 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->normalizedshape_,iVar2 + (this->normalizedshape_).current_size_);
    memcpy(((this->normalizedshape_).rep_)->elements + (this->normalizedshape_).current_size_,
           ((from->normalizedshape_).rep_)->elements,
           (long)(from->normalizedshape_).current_size_ << 3);
    (this->normalizedshape_).current_size_ =
         (this->normalizedshape_).current_size_ + (from->normalizedshape_).current_size_;
  }
  if ((from != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_)
     && (from->gamma_ != (WeightParams *)0x0)) {
    if (this->gamma_ == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar5);
      this->gamma_ = pWVar5;
    }
    pWVar5 = from->gamma_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->gamma_,pWVar5);
  }
  if ((from != (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_)
     && (from->beta_ != (WeightParams *)0x0)) {
    if (this->beta_ == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar5);
      this->beta_ = pWVar5;
    }
    pWVar5 = from->beta_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->beta_,pWVar5);
  }
  fVar1 = from->eps_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->eps_ = fVar1;
  }
  return;
}

Assistant:

void LayerNormalizationLayerParams::MergeFrom(const LayerNormalizationLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LayerNormalizationLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  normalizedshape_.MergeFrom(from.normalizedshape_);
  if (from.has_gamma()) {
    mutable_gamma()->::CoreML::Specification::WeightParams::MergeFrom(from.gamma());
  }
  if (from.has_beta()) {
    mutable_beta()->::CoreML::Specification::WeightParams::MergeFrom(from.beta());
  }
  if (from.eps() != 0) {
    set_eps(from.eps());
  }
}